

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O2

int get_self_ip_iface(CMTransport_trace trace_func,void *trace_data,char *iface)

{
  ushort uVar1;
  uint uVar2;
  sockaddr *psVar3;
  int iVar4;
  int iVar5;
  in_addr_t iVar6;
  char *pcVar7;
  size_t __n;
  char **ppcVar8;
  ifaddrs *piVar9;
  char *pcVar10;
  hostent *phVar11;
  anon_union_8_2_d20b7a2c_for_ifc_ifcu __ptr;
  ulong uVar12;
  uint uVar13;
  in_addr *in;
  uint *puVar14;
  void *pvVar15;
  char *__cp;
  ifaddrs *if_addrs;
  ifconf ifaces;
  char buf [46];
  char str_2 [16];
  char hostname_buf [256];
  
  piVar9 = (ifaddrs *)&if_addrs;
  if_addrs = (ifaddrs *)0x0;
  iVar4 = getifaddrs(piVar9);
  if (iVar4 == 0) {
    while (piVar9 = piVar9->ifa_next, piVar9 != (ifaddrs *)0x0) {
      psVar3 = piVar9->ifa_addr;
      if (psVar3 != (sockaddr *)0x0) {
        uVar1 = psVar3->sa_family;
        if ((uVar1 & 0xfff7) == 2) {
          pcVar10 = psVar3->sa_data + 6;
          if (uVar1 == 2) {
            pcVar10 = psVar3->sa_data + 2;
          }
          pcVar7 = piVar9->ifa_name;
          pcVar10 = inet_ntop((uint)uVar1,pcVar10,buf,0x2e);
          (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> IP possibility -> %s : %s",pcVar7,
                        pcVar10);
          if ((uVar1 == 2) && ((get_self_ip_iface_first_call & 1) == 0)) {
            pcVar10 = piVar9->ifa_name;
            iVar4 = 2;
            pcVar7 = inet_ntop(2,psVar3->sa_data + 2,buf,0x2e);
            dump_output(iVar4,"\tADIOS2_IP_CONFIG Possible interface %s : IPV4 %s\n",pcVar10,pcVar7)
            ;
          }
        }
      }
    }
    if ((iface != (char *)0x0) || (iface = getenv("ADIOS2_INTERFACE"), iface != (char *)0x0)) {
      pvVar15 = trace_data;
      (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> searching for interface %s\n",iface);
      if (get_self_ip_iface_first_call == 0) {
        dump_output((int)pvVar15,"\tADIOS2_IP_CONFIG interface %s requested\n",iface);
      }
      piVar9 = (ifaddrs *)&if_addrs;
      while (piVar9 = piVar9->ifa_next, piVar9 != (ifaddrs *)0x0) {
        psVar3 = piVar9->ifa_addr;
        if ((psVar3 != (sockaddr *)0x0) && (psVar3->sa_family == 2)) {
          pcVar10 = piVar9->ifa_name;
          __n = strlen(iface);
          iVar4 = strncmp(pcVar10,iface,__n);
          if (iVar4 == 0) {
            __cp = psVar3->sa_data + 2;
            pcVar7 = inet_ntop(2,__cp,buf,0x2e);
            (*trace_func)((CManager)trace_data,
                          "CM<IP_CONFIG> Interface specified, returning ->%s : %s",pcVar10,pcVar7);
            if (get_self_ip_iface_first_call == 0) {
              iVar4 = 2;
              pcVar10 = inet_ntop(2,__cp,buf,0x2e);
              dump_output(iVar4,"\tADIOS2_IP_CONFIG interface %s found, using IP %s\n",iface,pcVar10
                         );
            }
            uVar13 = *(uint *)__cp;
            free(if_addrs);
            get_self_ip_iface_first_call = 1;
            return uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
          }
        }
      }
      printf("Warning!  ADIOS2_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,iface);
    }
    get_self_ip_iface_first_call = 1;
    gethostname(hostname_buf,0x100);
    pcVar10 = index(hostname_buf,0x2e);
    if ((pcVar10 != (char *)0x0) &&
       (phVar11 = gethostbyname(hostname_buf), phVar11 != (hostent *)0x0)) {
      ppcVar8 = phVar11->h_addr_list;
      do {
        puVar14 = (uint *)*ppcVar8;
        if (puVar14 == (uint *)0x0) goto LAB_00104a7b;
        ppcVar8 = ppcVar8 + 1;
      } while ((char)*puVar14 == '\x7f');
      inet_ntop(2,puVar14,(char *)&ifaces,0x10);
      (*trace_func)((CManager)trace_data,
                    "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s",&ifaces);
      free(if_addrs);
      goto LAB_00104b63;
    }
    phVar11 = (hostent *)0x0;
LAB_00104a7b:
    piVar9 = (ifaddrs *)&if_addrs;
    while (piVar9 = piVar9->ifa_next, piVar9 != (ifaddrs *)0x0) {
      psVar3 = piVar9->ifa_addr;
      if (((psVar3 != (sockaddr *)0x0) && (psVar3->sa_family == 2)) &&
         ((piVar9->ifa_flags & 8) == 0)) {
        pcVar10 = piVar9->ifa_name;
        pcVar7 = inet_ntop(2,psVar3->sa_data + 2,buf,0x2e);
        (*trace_func)((CManager)trace_data,
                      "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",pcVar10,
                      pcVar7);
        uVar13 = *(uint *)(psVar3->sa_data + 2);
        free(if_addrs);
        return uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      }
    }
  }
  else {
    phVar11 = (hostent *)0x0;
  }
  gethostname(hostname_buf,0x100);
  pcVar10 = strchr(hostname_buf,0x2e);
  if (pcVar10 != (char *)0x0) {
    phVar11 = gethostbyname(hostname_buf);
  }
  if (phVar11 == (hostent *)0x0) {
LAB_00104b6e:
    uVar13 = 0;
    iVar4 = socket(2,2,0);
    ifaces.ifc_len = 0xa00;
    __ptr.ifcu_buf = (__caddr_t)malloc(0xa00);
    ifaces.ifc_ifcu.ifcu_buf = __ptr.ifcu_buf;
    iVar5 = ioctl(iVar4,0x8912,&ifaces);
    if (-1 < iVar5) {
      uVar12 = (ulong)(long)ifaces.ifc_len / 0x28;
      puVar14 = (uint *)((long)&(ifaces.ifc_ifcu.ifcu_req)->ifr_ifru + 4);
      while (iVar5 = (int)uVar12, uVar12 = (ulong)(iVar5 - 1), iVar5 != 0) {
        ioctl(iVar4,0x8913,puVar14 + -5);
        uVar13 = puVar14[-1];
        if ((uVar13 & 8) == 0) {
          if ((uVar13 & 1) == 0) {
            uVar13 = *puVar14;
            uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
            pcVar10 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP";
          }
          else {
            uVar2 = *puVar14;
            if ((uVar13 & 0x40) != 0) {
              if ((uVar2 == 0) || (uVar2 == 0x7f000001)) goto LAB_00104c50;
              uVar13 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
              inet_ntop(2,puVar14,str_2,0x10);
              uVar2 = *puVar14;
              (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s"
                            ,(ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                    | uVar2 << 0x18),str_2);
              goto LAB_00104ca7;
            }
            uVar13 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
            ;
            pcVar10 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING";
          }
          (*trace_func)((CManager)trace_data,pcVar10,(ulong)uVar13);
        }
        else {
          pcVar10 = inet_ntoa((in_addr)*puVar14);
          (*trace_func)((CManager)trace_data,
                        "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",pcVar10);
        }
LAB_00104c50:
        puVar14 = puVar14 + 10;
      }
      uVar13 = 0;
    }
LAB_00104ca7:
    close(iVar4);
    free(__ptr.ifcu_buf);
    if (uVar13 != 0) {
      return uVar13;
    }
    pcVar10 = getenv("ADIOS2_LAST_RESORT_IP_ADDR");
    (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Get self IP addr at last resort");
    if (pcVar10 == (char *)0x0) {
      return 0;
    }
    (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Translating last resort %s",pcVar10);
    iVar6 = inet_addr(pcVar10);
    return iVar6;
  }
  ppcVar8 = phVar11->h_addr_list;
  do {
    puVar14 = (uint *)*ppcVar8;
    if (puVar14 == (uint *)0x0) goto LAB_00104b6e;
    ppcVar8 = ppcVar8 + 1;
  } while ((char)*puVar14 == '\x7f');
  inet_ntop(2,puVar14,(char *)&ifaces,0x10);
  uVar13 = *puVar14;
  (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Get self IP addr %lx, net %s",
                (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18),&ifaces);
LAB_00104b63:
  uVar13 = *puVar14;
  return uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
}

Assistant:

static int
get_self_ip_iface(CMTransport_trace trace_func, void* trace_data, char *iface)
{
    struct hostent *host = NULL;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
    static int first_call = 1;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    trace_func(trace_data, "CM<IP_CONFIG> IP possibility -> %s : %s",
		       if_addr->ifa_name,
		       inet_ntop(family, tmp, buf, sizeof(buf)));
	    if ((family == AF_INET) && first_call) {
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV4 %s\n",
			    if_addr->ifa_name,
			    inet_ntop(family, tmp, buf, sizeof(buf)));
	    } else {
		// until we support IPV6, don't dump info
		//dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV6 %s\n",
		//	    if_addr->ifa_name,
		//	    inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if (!iface) iface = getenv(IPCONFIG_ENVVAR_PREFIX "INTERFACE");
	if (iface != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> searching for interface %s\n", iface);
	    if (first_call) dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s requested\n", iface);
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
		uint32_t IP;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strncmp(if_addr->ifa_name, iface, strlen(iface)) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		trace_func(trace_data, "CM<IP_CONFIG> Interface specified, returning ->%s : %s",
			   if_addr->ifa_name,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		if (first_call)
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s found, using IP %s\n", iface,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		IP = ntohl(*(uint32_t*)tmp);
		free(if_addrs);
		first_call = 0;
		return IP;
	    }
	    printf("Warning!  " IPCONFIG_ENVVAR_PREFIX "INTERFACE specified as \"%s\", but no active interface by that name found\n", iface);
	}
	    
	first_call = 0;
	gethostname(hostname_buf, sizeof(hostname_buf));
	if (index(hostname_buf, '.') != NULL) {
	    /* don't even check for host if not fully qualified */
	    host = gethostbyname(hostname_buf);
	}
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    char str[INET_ADDRSTRLEN];
					      
		    inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		    trace_func(trace_data, "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s", str);
		    free(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    trace_func(trace_data, "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    free(if_addrs);
	    return ret_ip;
	}
    }
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    if (strchr(hostname_buf, '.') != NULL) {
	/* don't even check for host if not fully qualified */
	host = gethostbyname(hostname_buf);
    }
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, net %s",
			   ntohl(in->s_addr), str);
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    char str[INET_ADDRSTRLEN];
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",
			   inet_ntoa(sai->sin_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
					      
	    inet_ntop(AF_INET, &(sai->sin_addr.s_addr), str, sizeof(str));
	    trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
		       ntohl(sai->sin_addr.s_addr), str);
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv(IPCONFIG_ENVVAR_PREFIX "LAST_RESORT_IP_ADDR");
	trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr at last resort");
	if (c != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}